

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSynchControllerBase::Init
          (CSynchControllerBase *this,CPalThread *pthrCurrent,ControllerType ctCtrlrType,
          ObjectDomain odObjectDomain,CObjectType *potObjectType,CSynchData *psdSynchData,
          WaitDomain wdWaitDomain)

{
  CPalThread *pCVar1;
  
  pCVar1 = (CPalThread *)pthread_getspecific(thObjKey);
  if (pCVar1 == (CPalThread *)0x0) {
    pCVar1 = CreateCurrentThreadData();
  }
  if (pCVar1 != pthrCurrent) {
    fprintf(_stderr,"] %s %s:%d","Init",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x3b);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == pthrCurrent\n");
  }
  this->m_pthrOwner = pthrCurrent;
  this->m_ctCtrlrType = ctCtrlrType;
  this->m_odObjectDomain = odObjectDomain;
  this->m_potObjectType = potObjectType;
  this->m_psdSynchData = psdSynchData;
  this->m_wdWaitDomain = wdWaitDomain;
  LOCK();
  psdSynchData->m_lRefCount = psdSynchData->m_lRefCount + 1;
  UNLOCK();
  CPalSynchronizationManager::AcquireLocalSynchLock(this->m_pthrOwner);
  if (this->m_wdWaitDomain != LocalWait) {
    CPalSynchronizationManager::AcquireSharedSynchLock(this->m_pthrOwner);
  }
  return 0;
}

Assistant:

PAL_ERROR CSynchControllerBase::Init(
        CPalThread * pthrCurrent,
        ControllerType ctCtrlrType,
        ObjectDomain odObjectDomain,
        CObjectType *potObjectType,
        CSynchData * psdSynchData,
        WaitDomain wdWaitDomain)
    {
        VALIDATEOBJECT(psdSynchData);

        _ASSERTE(InternalGetCurrentThread() == pthrCurrent);

        // Initialize internal controller data
        m_pthrOwner      = pthrCurrent;
        m_ctCtrlrType    = ctCtrlrType;
        m_odObjectDomain = odObjectDomain;        
        m_potObjectType  = potObjectType;
        m_psdSynchData   = psdSynchData;
        m_wdWaitDomain   = wdWaitDomain;

        // Add reference to target synch data
        m_psdSynchData->AddRef();

        // Acquire lock implied by the controller
        CPalSynchronizationManager::AcquireLocalSynchLock(m_pthrOwner);
        if (LocalWait != m_wdWaitDomain)
        {
            CPalSynchronizationManager::AcquireSharedSynchLock(m_pthrOwner);
        }

        return NO_ERROR;
    }